

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSGDiscrete.cpp
# Opt level: O0

string * __thiscall POSGDiscrete::SoftPrint_abi_cxx11_(POSGDiscrete *this)

{
  ulong uVar1;
  ulong uVar2;
  ostream *poVar3;
  const_reference ppRVar4;
  undefined8 uVar5;
  long *in_RSI;
  string *in_RDI;
  MultiAgentDecisionProcessDiscrete *in_stack_00000028;
  Index agentI;
  stringstream ss;
  size_type in_stack_fffffffffffffd78;
  vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_> *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffda8;
  E *in_stack_fffffffffffffdb0;
  string local_210 [36];
  uint local_1ec;
  string local_1e8 [48];
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [272];
  POSG *in_stack_ffffffffffffff88;
  
  std::__cxx11::stringstream::stringstream(local_198);
  MultiAgentDecisionProcessDiscrete::SoftPrint_abi_cxx11_(in_stack_00000028);
  std::operator<<(local_188,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  POSG::SoftPrint_abi_cxx11_(in_stack_ffffffffffffff88);
  std::operator<<(local_188,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  if ((*(byte *)(in_RSI + 0x49) & 1) != 0) {
    local_1ec = 0;
    while( true ) {
      uVar1 = (ulong)local_1ec;
      uVar2 = (**(code **)(*in_RSI + 0x10))();
      if (uVar2 <= uVar1) break;
      poVar3 = std::operator<<(local_188,"Reward model for agent ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1ec);
      poVar3 = std::operator<<(poVar3,": ");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      ppRVar4 = std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::at
                          (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      (*((*ppRVar4)->super_RewardModel).super_RewardModelDiscreteInterface.super_QTableInterface.
        _vptr_QTableInterface[5])(local_210);
      poVar3 = std::operator<<(local_188,local_210);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_210);
      local_1ec = local_1ec + 1;
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_198);
    return in_RDI;
  }
  uVar5 = __cxa_allocate_exception(0x28);
  E::E(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  __cxa_throw(uVar5,&E::typeinfo,E::~E);
}

Assistant:

string POSGDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << MultiAgentDecisionProcessDiscrete::SoftPrint();
    ss << POSG::SoftPrint();

    if(_m_initialized)
    {
        for(Index agentI = 0; agentI < GetNrAgents(); agentI++)
        {
            ss << "Reward model for agent "<<agentI<<": " << endl;
            ss << _m_p_rModel.at(agentI)->SoftPrint() << endl;
        }
    }
    else
        throw E("POSGDiscrete components (reward model) not initialized");

    return(ss.str());
}